

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeField(WasmBinaryWriter *this,Field *field)

{
  PackedType PVar1;
  Type type;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int __fd;
  LEB<int,_signed_char> *this_00;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<int,_signed_char> local_20;
  LEB<int,_signed_char> local_1c;
  
  type.id = (field->type).id;
  if ((type.id == 2) && (PVar1 = field->packedType, PVar1 != not_packed)) {
    if (PVar1 == i16) {
      __fd = (int)this->o;
      this_00 = &local_20;
      local_20.value = -9;
    }
    else {
      if (PVar1 != i8) {
        handle_unreachable("invalid packed type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x6e3);
      }
      __fd = (int)this->o;
      this_00 = &local_1c;
      local_1c.value = -8;
    }
    LEB<int,_signed_char>::write(this_00,__fd,in_RDX,in_RCX);
    __buf = extraout_RDX_00;
  }
  else {
    writeType(this,type);
    __buf = extraout_RDX;
  }
  local_24.value = field->mutable_;
  LEB<unsigned_int,_unsigned_char>::write(&local_24,(int)this->o,__buf,in_RCX);
  return;
}

Assistant:

void WasmBinaryWriter::writeField(const Field& field) {
  if (field.type == Type::i32 && field.packedType != Field::not_packed) {
    if (field.packedType == Field::i8) {
      o << S32LEB(BinaryConsts::EncodedType::i8);
    } else if (field.packedType == Field::i16) {
      o << S32LEB(BinaryConsts::EncodedType::i16);
    } else {
      WASM_UNREACHABLE("invalid packed type");
    }
  } else {
    writeType(field.type);
  }
  o << U32LEB(field.mutable_);
}